

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

bool __thiscall cmValue::IsInternallyOn(cmValue *this,string_view value)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)value._M_len;
  if ((((this == (cmValue *)0x4) && ((*pbVar1 | 0x20) == 0x69)) && (pbVar1[1] == 0x5f)) &&
     ((pbVar1[2] | 0x20) == 0x6f)) {
    return (pbVar1[3] & 0xdf) == 0x4e;
  }
  return false;
}

Assistant:

bool cmValue::IsInternallyOn(cm::string_view value) noexcept
{
  return (value.size() == 4) &&             //
    (value[0] == 'I' || value[0] == 'i') && //
    (value[1] == '_') &&                    //
    (value[2] == 'O' || value[2] == 'o') && //
    (value[3] == 'N' || value[3] == 'n');
}